

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Slot __thiscall Am_Object_Advanced::Get_Slot(Am_Object_Advanced *this,Am_Slot_Key key)

{
  bool bVar1;
  Am_Slot_Data *pAVar2;
  undefined6 in_register_00000032;
  size_t sVar3;
  Am_Slot_Data *local_50;
  Am_Slot_Data *new_slot;
  Am_Slot_Data *local_38;
  Am_Slot_Data *new_slot_1;
  Am_Slot_Data *slot;
  Am_Slot_Data **slot_array;
  uint i;
  Am_Slot_Key key_local;
  Am_Object_Advanced *this_local;
  
  sVar3 = CONCAT62(in_register_00000032,key);
  slot_array._6_2_ = key;
  _i = this;
  if ((this->super_Am_Object).data == (Am_Object_Data *)0x0) {
    Am_Error("** Get_Slot called on a (0L) object");
  }
  if ((((this->super_Am_Object).data)->data).data != (char *)0x0) {
    if (key == 10) {
      Am_Slot::Am_Slot((Am_Slot *)&this_local,&((this->super_Am_Object).data)->owner_slot);
    }
    else {
      slot = (Am_Slot_Data *)(((this->super_Am_Object).data)->data).data;
      for (slot_array._0_4_ = (((this->super_Am_Object).data)->data).length; (uint)slot_array != 0;
          slot_array._0_4_ = (uint)slot_array - 1) {
        new_slot_1 = *(Am_Slot_Data **)&slot->super_Am_Value;
        if (key == new_slot_1->key) {
          Am_Slot::Am_Slot((Am_Slot *)&this_local,new_slot_1);
          return (Am_Slot)(Am_Slot_Data *)this_local;
        }
        slot = (Am_Slot_Data *)&(slot->super_Am_Value).value;
      }
      if (((this->super_Am_Object).data)->prototype != (Am_Object_Data *)0x0) {
        sVar3 = (size_t)key;
        new_slot_1 = Am_Object_Data::find_slot(((this->super_Am_Object).data)->prototype,key);
        if ((new_slot_1 != (Am_Slot_Data *)0x0) &&
           ((*(ushort *)&new_slot_1->field_0x38 & 0x20) == 0)) {
          if ((*(ushort *)&new_slot_1->field_0x38 >> 8 & 3) == 3) {
            Am_Slot::Am_Slot((Am_Slot *)&this_local,new_slot_1);
            return (Am_Slot)(Am_Slot_Data *)this_local;
          }
          pAVar2 = (Am_Slot_Data *)Am_Slot_Data::operator_new((Am_Slot_Data *)0x40,sVar3);
          Am_Slot_Data::Am_Slot_Data(pAVar2,(this->super_Am_Object).data,slot_array._6_2_);
          *(ushort *)&pAVar2->field_0x38 =
               *(ushort *)&pAVar2->field_0x38 & 0xff00 | *(ushort *)&new_slot_1->field_0x38 & 0xe0;
          if ((*(ushort *)&new_slot_1->field_0x38 >> 8 & 3) == 1) {
            *(ushort *)&pAVar2->field_0x38 =
                 *(ushort *)&pAVar2->field_0x38 & 0xff00 | *(ushort *)&pAVar2->field_0x38 & 0xff | 3
            ;
          }
          pAVar2->type_check = new_slot_1->type_check;
          pAVar2->enabled_demons = new_slot_1->enabled_demons;
          *(ushort *)&pAVar2->field_0x38 =
               *(ushort *)&pAVar2->field_0x38 & 0xfcff |
               (*(ushort *)&new_slot_1->field_0x38 >> 8 & 3) << 8;
          local_38 = pAVar2;
          if ((*(ushort *)&new_slot_1->field_0x38 >> 8 & 3) == 0) {
            (pAVar2->super_Am_Value).type = 0x1002;
          }
          else {
            (pAVar2->super_Am_Value).type = (new_slot_1->super_Am_Value).type;
            bVar1 = Am_Type_Is_Ref_Counted((new_slot_1->super_Am_Value).type);
            if ((bVar1) && ((new_slot_1->super_Am_Value).value.wrapper_value != (Am_Wrapper *)0x0))
            {
              Am_Wrapper::Note_Reference((new_slot_1->super_Am_Value).value.wrapper_value);
            }
            (local_38->super_Am_Value).value = (new_slot_1->super_Am_Value).value;
          }
          DynArray::Add(&((this->super_Am_Object).data)->data,(char *)&local_38);
          Am_Slot::Am_Slot((Am_Slot *)&this_local,local_38);
          return (Am_Slot)(Am_Slot_Data *)this_local;
        }
      }
      pAVar2 = (Am_Slot_Data *)Am_Slot_Data::operator_new((Am_Slot_Data *)0x40,sVar3);
      Am_Slot_Data::Am_Slot_Data(pAVar2,(this->super_Am_Object).data,slot_array._6_2_);
      *(ushort *)&pAVar2->field_0x38 = *(ushort *)&pAVar2->field_0x38 & 0xff00 | 3;
      (pAVar2->super_Am_Value).type = 0x1002;
      (pAVar2->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
      local_50 = pAVar2;
      DynArray::Add(&((this->super_Am_Object).data)->data,(char *)&local_50);
      Am_Slot::Am_Slot((Am_Slot *)&this_local,local_50);
    }
    return (Am_Slot)(Am_Slot_Data *)this_local;
  }
  Am_Error("** Get_Slot called on a destroyed object");
}

Assistant:

Am_Slot
Am_Object_Advanced::Get_Slot(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("** Get_Slot called on a (0L) object");
  if (!data->data.data)
    Am_Error("** Get_Slot called on a destroyed object");
  if (key == Am_OWNER)
    return &data->owner_slot;

  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data->data.length, slot_array = (Am_Slot_Data **)data->data.data;
       i > 0; --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key)
      return slot;
  }
  if (data->prototype) {
    slot = data->prototype->find_slot(key);
    if (slot && !(slot->flags & BIT_IS_PART)) {
      if (slot->rule == Am_STATIC)
        return slot;
      Am_Slot_Data *new_slot = new Am_Slot_Data(data, key);
      new_slot->flags = slot->flags & DATA_BITS;
      if (slot->rule == Am_INHERIT)
        new_slot->flags |= BIT_INHERITS | BIT_IS_INHERITED;
      new_slot->type_check = slot->type_check;
      new_slot->enabled_demons = slot->enabled_demons;
      new_slot->rule = slot->rule;
      if (slot->rule == Am_LOCAL)
        new_slot->type = Am_MISSING_SLOT;
      else {
        new_slot->type = slot->type;
        if (Am_Type_Is_Ref_Counted(slot->type) && slot->value.wrapper_value)
          slot->value.wrapper_value->Note_Reference();
        new_slot->value = slot->value;
      }
      data->data.Add((char *)&new_slot);
      return new_slot;
    }
  }
  Am_Slot_Data *new_slot = new Am_Slot_Data(data, key);
  new_slot->flags = BIT_INHERITS | BIT_IS_INHERITED;
  new_slot->type = Am_MISSING_SLOT;
  new_slot->value.wrapper_value = nullptr;
  data->data.Add((char *)&new_slot);
  return new_slot;
}